

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_1148b1a::HandleCompareCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *psVar1;
  cmExecutionStatus *this;
  bool bVar2;
  __type _Var3;
  size_type sVar4;
  cmMakefile *pcVar5;
  undefined1 local_e0 [8];
  string e;
  string_view local_b0;
  bool local_99;
  const_reference pvStack_98;
  bool result;
  string *outvar;
  string *right;
  string *left;
  string e_1;
  string *mode;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  this = local_20;
  if (sVar4 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"sub-command COMPARE requires a mode to be specified.",&local_41)
    ;
    cmExecutionStatus::SetError(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  else {
    e_1.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)status_local,1);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            e_1.field_2._8_8_,"EQUAL");
    if ((((bVar2) ||
         (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)e_1.field_2._8_8_,"NOTEQUAL"), bVar2)) ||
        (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)e_1.field_2._8_8_,"LESS"), bVar2)) ||
       (((bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)e_1.field_2._8_8_,"LESS_EQUAL"), bVar2 ||
         (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)e_1.field_2._8_8_,"GREATER"), bVar2)) ||
        (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)e_1.field_2._8_8_,"GREATER_EQUAL"), bVar2)))) {
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)status_local);
      if (sVar4 < 5) {
        cmStrCat<char_const(&)[27],std::__cxx11::string_const&,char_const(&)[46]>
                  ((string *)&left,(char (*) [27])"sub-command COMPARE, mode ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   e_1.field_2._8_8_,(char (*) [46])0x1263b02);
        cmExecutionStatus::SetError(local_20,(string *)&left);
        args_local._7_1_ = 0;
        std::__cxx11::string::~string((string *)&left);
      }
      else {
        right = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)status_local,2);
        outvar = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)status_local,3);
        pvStack_98 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)status_local,4);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )e_1.field_2._8_8_,"LESS");
        if (bVar2) {
          local_99 = std::operator<(right,outvar);
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)e_1.field_2._8_8_,"LESS_EQUAL");
          if (bVar2) {
            local_99 = std::operator<=(right,outvar);
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)e_1.field_2._8_8_,"GREATER");
            if (bVar2) {
              local_99 = std::operator>(right,outvar);
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)e_1.field_2._8_8_,"GREATER_EQUAL");
              if (bVar2) {
                local_99 = std::operator>=(right,outvar);
              }
              else {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)e_1.field_2._8_8_,"EQUAL");
                if (bVar2) {
                  local_99 = std::operator==(right,outvar);
                }
                else {
                  _Var3 = std::operator==(right,outvar);
                  local_99 = (bool)((_Var3 ^ 0xffU) & 1);
                }
              }
            }
          }
        }
        if (local_99 == false) {
          pcVar5 = cmExecutionStatus::GetMakefile(local_20);
          psVar1 = pvStack_98;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)((long)&e.field_2 + 8),"0")
          ;
          cmMakefile::AddDefinition(pcVar5,psVar1,stack0xffffffffffffff40);
        }
        else {
          pcVar5 = cmExecutionStatus::GetMakefile(local_20);
          psVar1 = pvStack_98;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b0,"1");
          cmMakefile::AddDefinition(pcVar5,psVar1,local_b0);
        }
        args_local._7_1_ = 1;
      }
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     "sub-command COMPARE does not recognize mode ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     e_1.field_2._8_8_);
      cmExecutionStatus::SetError
                (local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_e0);
      args_local._7_1_ = 0;
      std::__cxx11::string::~string((string *)local_e0);
    }
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleCompareCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.size() != 5) {
    status.SetError("COMPARE must be called with four arguments.");
    return false;
  }

  static std::map<cm::string_view,
                  std::function<bool(const cmCMakePath&,
                                     const cmCMakePath&)>> const operators{
    { "EQUAL"_s,
      [](const cmCMakePath& path1, const cmCMakePath& path2) -> bool {
        return path1 == path2;
      } },
    { "NOT_EQUAL"_s,
      [](const cmCMakePath& path1, const cmCMakePath& path2) -> bool {
        return path1 != path2;
      } }
  };

  const auto op = operators.find(args[2]);
  if (op == operators.end()) {
    status.SetError(cmStrCat(
      "COMPARE called with an unknown comparison operator: ", args[2], "."));
    return false;
  }

  if (args[4].empty()) {
    status.SetError("Invalid name for output variable.");
    return false;
  }

  cmCMakePath path1(args[1]);
  cmCMakePath path2(args[3]);
  auto result = op->second(path1, path2);

  status.GetMakefile().AddDefinitionBool(args[4], result);

  return true;
}